

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  u8 *p;
  ulong in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  u8 *aWrite;
  sqlite3_file *fd;
  int a_1;
  Pgno *aNew;
  int nOvfl;
  u32 ovflSize;
  int a;
  uchar *pBufStart;
  BtShared *pBt;
  MemPage *pPage;
  int iIdx;
  int rc;
  uchar *aPayload;
  DbPage *pDbPage;
  Pgno nextPage;
  u8 aSave [4];
  undefined4 in_stack_ffffffffffffff48;
  Pgno in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  MemPage **in_stack_ffffffffffffff68;
  sqlite3_file *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  void *local_80;
  int local_6c;
  uint local_50;
  int local_4c;
  ulong local_38;
  int local_30;
  uint local_2c;
  int local_1c;
  uint local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  local_50 = 0;
  lVar3 = *(long *)(in_RDI + 0x88);
  puVar4 = *(undefined8 **)(in_RDI + 0x20);
  if (*(ushort *)(lVar3 + 0x18) <= *(ushort *)(in_RDI + 0x56)) {
    local_1c = sqlite3CorruptError(0);
    goto LAB_0016d1dd;
  }
  getCellInfo((BtCursor *)0x16cb98);
  lVar5 = *(long *)(in_RDI + 0x38);
  if ((ulong)(*(int *)(puVar4 + 7) - (uint)*(ushort *)(in_RDI + 0x44)) <
      (ulong)(lVar5 - *(long *)(lVar3 + 0x50))) {
    local_1c = sqlite3CorruptError(0);
    goto LAB_0016d1dd;
  }
  if (in_ESI < *(ushort *)(in_RDI + 0x44)) {
    local_6c = in_EDX;
    if ((uint)*(ushort *)(in_RDI + 0x44) < in_EDX + in_ESI) {
      local_6c = *(ushort *)(in_RDI + 0x44) - in_ESI;
    }
    local_4c = copyPayload(in_stack_ffffffffffffff68,
                           (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (int)in_stack_ffffffffffffff58,
                           (DbPage *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_2c = 0;
    local_38 = in_RCX + (long)local_6c;
    local_30 = in_EDX - local_6c;
  }
  else {
    local_2c = in_ESI - *(ushort *)(in_RDI + 0x44);
    local_38 = in_RCX;
    local_30 = in_EDX;
  }
  if ((local_4c == 0) && (local_30 != 0)) {
    uVar6 = *(int *)(puVar4 + 7) - 4;
    local_10 = sqlite3Get4byte((u8 *)(lVar5 + (ulong)*(ushort *)(in_RDI + 0x44)));
    if ((*(byte *)(in_RDI + 1) & 4) == 0) {
      uVar7 = (((*(int *)(in_RDI + 0x40) - (uint)*(ushort *)(in_RDI + 0x44)) + uVar6) - 1) / uVar6;
      if (*(long *)(in_RDI + 0x10) == 0) {
LAB_0016cd97:
        iVar8 = sqlite3FaultSim(in_stack_ffffffffffffff54);
        if (iVar8 == 0) {
          local_80 = sqlite3Realloc(in_stack_ffffffffffffff68,
                                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        }
        else {
          local_80 = (void *)0x0;
        }
        if (local_80 == (void *)0x0) {
          local_1c = 7;
          goto LAB_0016d1dd;
        }
        *(void **)(in_RDI + 0x10) = local_80;
      }
      else {
        in_stack_ffffffffffffff64 = uVar7 << 2;
        iVar8 = sqlite3MallocSize((void *)0x16cd8d);
        if (iVar8 < in_stack_ffffffffffffff64) goto LAB_0016cd97;
      }
      memset(*(void **)(in_RDI + 0x10),0,(long)(int)uVar7 << 2);
      *(byte *)(in_RDI + 1) = *(byte *)(in_RDI + 1) | 4;
    }
    else {
      in_stack_ffffffffffffff58 = *(void **)(in_RDI + 0x10);
      if (*(int *)((long)in_stack_ffffffffffffff58 + ((ulong)local_2c / (ulong)uVar6) * 4) != 0) {
        local_50 = local_2c / uVar6;
        local_10 = *(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)local_50 * 4);
        local_2c = local_2c % uVar6;
      }
    }
    while (local_10 != 0) {
      if (*(uint *)(puVar4 + 8) < local_10) {
        local_1c = sqlite3CorruptError(0);
        goto LAB_0016d1dd;
      }
      *(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)local_50 * 4) = local_10;
      if (local_2c < uVar6) {
        in_stack_ffffffffffffff7c = local_30;
        if (uVar6 < local_30 + local_2c) {
          in_stack_ffffffffffffff7c = uVar6 - local_2c;
        }
        if ((((in_R8D == 0) && (local_2c == 0)) &&
            (iVar8 = sqlite3PagerDirectReadOk
                               ((Pager *)CONCAT44(in_stack_ffffffffffffff54,
                                                  in_stack_ffffffffffffff50),
                                in_stack_ffffffffffffff4c), iVar8 != 0)) && (in_RCX <= local_38 - 4)
           ) {
          in_stack_ffffffffffffff70 = sqlite3PagerFile((Pager *)*puVar4);
          in_stack_ffffffffffffff68 = (MemPage **)(local_38 - 4);
          uVar1 = *(undefined4 *)in_stack_ffffffffffffff68;
          local_4c = sqlite3OsRead((sqlite3_file *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          local_10 = sqlite3Get4byte((u8 *)in_stack_ffffffffffffff68);
          *(undefined4 *)in_stack_ffffffffffffff68 = uVar1;
        }
        else {
          local_4c = sqlite3PagerGet((Pager *)CONCAT44(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60),
                                     (Pgno)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                     (DbPage **)
                                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                     in_stack_ffffffffffffff4c);
          if (local_4c == 0) {
            p = (u8 *)sqlite3PagerGetData((DbPage *)&DAT_aaaaaaaaaaaaaaaa);
            local_10 = sqlite3Get4byte(p);
            local_4c = copyPayload(in_stack_ffffffffffffff68,
                                   (void *)CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),
                                   (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                   (int)in_stack_ffffffffffffff58,
                                   (DbPage *)
                                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            sqlite3PagerUnref((DbPage *)0x16d141);
            local_2c = 0;
          }
        }
        local_30 = local_30 - in_stack_ffffffffffffff7c;
        if (local_30 == 0) {
          local_1c = local_4c;
          goto LAB_0016d1dd;
        }
        local_38 = local_38 + (long)in_stack_ffffffffffffff7c;
      }
      else {
        if (*(int *)(*(long *)(in_RDI + 0x10) + (long)(int)(local_50 + 1) * 4) == 0) {
          local_4c = getOverflowPage((BtShared *)
                                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                     (Pgno)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                     in_stack_ffffffffffffff68,
                                     (Pgno *)CONCAT44(in_stack_ffffffffffffff64,
                                                      in_stack_ffffffffffffff60));
        }
        else {
          local_10 = *(u32 *)(*(long *)(in_RDI + 0x10) + (long)(int)(local_50 + 1) * 4);
        }
        local_2c = local_2c - uVar6;
      }
      if (local_4c != 0) break;
      local_50 = local_50 + 1;
    }
  }
  if ((local_4c == 0) && (local_30 != 0)) {
    local_1c = sqlite3CorruptError(0);
  }
  else {
    local_1c = local_4c;
  }
LAB_0016d1dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew;
        if( sqlite3FaultSim(413) ){
          aNew = 0;
        }else{
          aNew = (Pgno*)sqlite3Realloc(pCur->aOverflow, nOvfl*2*sizeof(Pgno));
        }
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* Sanity check the validity of the overflow page cache */
      assert( pCur->aOverflow[0]==nextPage
           || pCur->aOverflow[0]==0
           || CORRUPT_DB );
      assert( pCur->aOverflow[0]!=0 || pCur->aOverflow[offset/ovflSize]==0 );

      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}